

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

_Bool ts_node__is_relevant(TSNode self,_Bool include_anonymous)

{
  TSNode self_00;
  undefined1 auVar1 [24];
  _Bool _Var2;
  TSSymbolMetadata TVar3;
  uint32_t uVar4;
  Subtree self_01;
  TSTree *in_stack_ffffffffffffffc8;
  TSLanguage *language;
  _Bool local_2b;
  _Bool local_29;
  Subtree tree;
  _Bool include_anonymous_local;
  
  auVar1 = self._8_24_;
  self_00.tree = in_stack_ffffffffffffffc8;
  self_00.context[0] = auVar1._0_4_;
  self_00.context[1] = auVar1._4_4_;
  self_00.context[2] = auVar1._8_4_;
  self_00.context[3] = auVar1._12_4_;
  self_00.id = (void *)auVar1._16_8_;
  self_01 = ts_node__subtree(self_00);
  if (include_anonymous) {
    _Var2 = ts_subtree_visible(self_01);
    local_29 = true;
    if (!_Var2) {
      uVar4 = ts_node__alias(&self);
      local_29 = uVar4 != 0;
    }
    return local_29;
  }
  _Var2 = ts_subtree_visible(self_01);
  if ((_Var2) && (_Var2 = ts_subtree_named(self_01), _Var2)) {
    return true;
  }
  uVar4 = ts_node__alias(&self);
  local_2b = false;
  if (uVar4 != 0) {
    language = (self.tree)->language;
    uVar4 = ts_node__alias(&self);
    TVar3 = ts_language_symbol_metadata(language,(TSSymbol)uVar4);
    local_2b = (_Bool)((byte)TVar3 >> 1 & 1);
  }
  return local_2b;
}

Assistant:

static inline bool ts_node__is_relevant(TSNode self, bool include_anonymous) {
  Subtree tree = ts_node__subtree(self);
  if (include_anonymous) {
    return ts_subtree_visible(tree) || ts_node__alias(&self);
  } else {
    return
      (ts_subtree_visible(tree) &&
       ts_subtree_named(tree)) ||
      (ts_node__alias(&self) &&
       ts_language_symbol_metadata(self.tree->language, ts_node__alias(&self)).named);
  }
}